

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit,int step)

{
  initializer_list<int> __l;
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  CheckHandler *in_RDI;
  int arg;
  value_type *__x;
  BenchmarkImp *in_stack_ffffffffffffff50;
  int line;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  char *in_stack_ffffffffffffff58;
  CheckHandler *this_01;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  CheckHandler *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *this_02;
  iterator piVar2;
  size_type in_stack_ffffffffffffff90;
  int local_58;
  CheckHandler local_50;
  byte local_41;
  vector<int,_std::allocator<int>_> local_40;
  byte local_21;
  CheckHandler local_20;
  int local_14;
  int local_10;
  int local_c;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  iVar1 = ArgsCnt(in_stack_ffffffffffffff50);
  local_21 = 0;
  if (iVar1 != -1) {
    iVar1 = ArgsCnt(in_stack_ffffffffffffff50);
    line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if (iVar1 != 1) {
      in_stack_ffffffffffffff68 = &local_20;
      CheckHandler::CheckHandler
                (in_RDI,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,line);
      local_21 = 1;
      CheckHandler::GetLog(in_stack_ffffffffffffff68);
      goto LAB_00165dcc;
    }
  }
  line = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  GetNullLogInstance();
LAB_00165dcc:
  if ((local_21 & 1) != 0) {
    CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165de5);
  }
  local_41 = 0;
  if (local_c < 0) {
    in_stack_ffffffffffffff60 = &local_40;
    CheckHandler::CheckHandler
              (in_RDI,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58,line);
    local_41 = 1;
    CheckHandler::GetLog((CheckHandler *)in_stack_ffffffffffffff60);
  }
  else {
    GetNullLogInstance();
  }
  if ((local_41 & 1) != 0) {
    CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165e6d);
  }
  if (local_c <= local_10) {
    GetNullLogInstance();
    for (local_58 = local_c; local_58 <= local_10; local_58 = local_14 + local_58) {
      __x = (value_type *)(in_RDI + 5);
      this_02 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff7c;
      piVar2 = (iterator)0x1;
      this_00 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&stack0xffffffffffffff7b;
      iVar1 = local_58;
      std::allocator<int>::allocator((allocator<int> *)0x165f94);
      __l._M_len = in_stack_ffffffffffffff90;
      __l._M_array = piVar2;
      std::vector<int,_std::allocator<int>_>::vector
                (this_02,__l,(allocator_type *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(this_00,__x);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
      std::allocator<int>::~allocator((allocator<int> *)0x165fd3);
    }
    return;
  }
  this_01 = &local_50;
  CheckHandler::CheckHandler
            (in_RDI,(char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
             (char *)this_01,line);
  CheckHandler::GetLog(this_01);
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165f0c);
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit, int step) {
  CHECK(ArgsCnt() == -1 || ArgsCnt() == 1);
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg+= step) {
    args_.push_back({arg});
  }
}